

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall
dnet::data_types::tensor<double,_2U>::tensor
          (tensor<double,_2U> *this,type *data,array<unsigned_int,_2UL> size)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_40;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  tensor(this,size);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_40,data);
  vec_flater<double,_2U>::flatten((output_type *)&local_28,&local_40);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_data,&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

tensor<T, N>::tensor(typename vector_dim<T, N>::type data, std::array<index_type, N> size)
                : tensor(size)
        {
            this->_data = vec_flater<T, N>::flatten(data);
        }